

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall
t_php_generator::generate_serialize_field
          (t_php_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  pointer pcVar1;
  pointer pcVar2;
  int iVar3;
  t_type *ttype;
  undefined4 extraout_var;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  t_struct *tstruct;
  char *pcVar6;
  t_base_type *ptVar7;
  undefined1 auVar8 [12];
  string local_d0;
  string name;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ttype = t_type::get_true_type(tfield->type_);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar3 != '\0') {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&name,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar5,&name,&tfield->name_);
    __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar3 != '\0') ||
     (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar3 != '\0')) {
    std::operator+(&local_50,prefix,&tfield->name_);
    generate_serialize_struct(this,out,tstruct,&local_50);
    pbVar5 = &local_50;
    goto LAB_00274a30;
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
  if ((char)iVar3 != '\0') {
    std::operator+(&local_70,prefix,&tfield->name_);
    generate_serialize_container(this,out,ttype,&local_70);
    pbVar5 = &local_70;
    goto LAB_00274a30;
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype), (char)iVar3 == '\0')) {
    pcVar1 = (prefix->_M_dataplus)._M_p;
    pcVar2 = (tfield->name_)._M_dataplus._M_p;
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s%s\' TYPE \'%s\'\n",pcVar1,pcVar2,
           *(undefined8 *)CONCAT44(extraout_var,iVar3));
    return;
  }
  std::operator+(&name,prefix,&tfield->name_);
  if (this->binary_inline_ == true) {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
      if ((char)iVar3 == '\0') goto LAB_00274f89;
      t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_d0);
      poVar4 = std::operator<<(poVar4,"$output .= pack(\'N\', $");
      poVar4 = std::operator<<(poVar4,(string *)&name);
      poVar4 = std::operator<<(poVar4,");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    else {
      ptVar7 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
      switch(ptVar7) {
      case (t_base_type *)0x0:
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::operator+(pbVar5,"compiler error: cannot serialize void field in a struct: ",&name);
        __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      case (t_base_type *)0x1:
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_d0);
        poVar4 = std::operator<<(poVar4,"$output .= pack(\'N\', strlen($");
        poVar4 = std::operator<<(poVar4,(string *)&name);
        poVar4 = std::operator<<(poVar4,"));");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&local_90);
        poVar4 = std::operator<<(poVar4,"$output .= $");
        poVar4 = std::operator<<(poVar4,(string *)&name);
        poVar4 = std::operator<<(poVar4,";");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_90);
        break;
      case (t_base_type *)0x2:
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_d0);
        poVar4 = std::operator<<(poVar4,"$output .= pack(\'c\', $");
        poVar4 = std::operator<<(poVar4,(string *)&name);
        poVar4 = std::operator<<(poVar4," ? 1 : 0);");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        break;
      case (t_base_type *)0x3:
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_d0);
        poVar4 = std::operator<<(poVar4,"$output .= pack(\'c\', $");
        poVar4 = std::operator<<(poVar4,(string *)&name);
        poVar4 = std::operator<<(poVar4,");");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        break;
      case (t_base_type *)0x4:
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_d0);
        poVar4 = std::operator<<(poVar4,"$output .= pack(\'n\', $");
        poVar4 = std::operator<<(poVar4,(string *)&name);
        poVar4 = std::operator<<(poVar4,");");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        break;
      case (t_base_type *)0x5:
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_d0);
        poVar4 = std::operator<<(poVar4,"$output .= pack(\'N\', $");
        poVar4 = std::operator<<(poVar4,(string *)&name);
        poVar4 = std::operator<<(poVar4,");");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        break;
      case (t_base_type *)0x6:
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_d0);
        poVar4 = std::operator<<(poVar4,"$output .= pack(\'N2\', $");
        poVar4 = std::operator<<(poVar4,(string *)&name);
        poVar4 = std::operator<<(poVar4," >> 32, $");
        poVar4 = std::operator<<(poVar4,(string *)&name);
        poVar4 = std::operator<<(poVar4," & 0xFFFFFFFF);");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        break;
      case (t_base_type *)0x7:
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_d0);
        poVar4 = std::operator<<(poVar4,"$output .= strrev(pack(\'d\', $");
        poVar4 = std::operator<<(poVar4,(string *)&name);
        poVar4 = std::operator<<(poVar4,"));");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        break;
      default:
        auVar8 = __cxa_allocate_exception(0x20);
        t_base_type::t_base_name_abi_cxx11_(&local_d0,ptVar7,auVar8._8_4_);
        std::operator+(auVar8._0_8_,"compiler error: no PHP name for base type ",&local_d0);
        __cxa_throw(auVar8._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
    }
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar4,"$xfer += $output->");
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
      if ((char)iVar3 != '\0') {
        poVar4 = std::operator<<(out,"writeI32($");
        poVar4 = std::operator<<(poVar4,(string *)&name);
        std::operator<<(poVar4,");");
      }
    }
    else {
      ptVar7 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
      switch(ptVar7) {
      case (t_base_type *)0x0:
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::operator+(pbVar5,"compiler error: cannot serialize void field in a struct: ",&name);
        __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      case (t_base_type *)0x1:
        pcVar6 = "writeString($";
        break;
      case (t_base_type *)0x2:
        pcVar6 = "writeBool($";
        break;
      case (t_base_type *)0x3:
        pcVar6 = "writeByte($";
        break;
      case (t_base_type *)0x4:
        pcVar6 = "writeI16($";
        break;
      case (t_base_type *)0x5:
        pcVar6 = "writeI32($";
        break;
      case (t_base_type *)0x6:
        pcVar6 = "writeI64($";
        break;
      case (t_base_type *)0x7:
        pcVar6 = "writeDouble($";
        break;
      default:
        auVar8 = __cxa_allocate_exception(0x20);
        t_base_type::t_base_name_abi_cxx11_(&local_d0,ptVar7,auVar8._8_4_);
        std::operator+(auVar8._0_8_,"compiler error: no PHP name for base type ",&local_d0);
        __cxa_throw(auVar8._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      poVar4 = std::operator<<(out,pcVar6);
      poVar4 = std::operator<<(poVar4,(string *)&name);
      std::operator<<(poVar4,");");
    }
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
  }
LAB_00274f89:
  pbVar5 = &name;
LAB_00274a30:
  std::__cxx11::string::~string((string *)pbVar5);
  return;
}

Assistant:

void t_php_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, prefix + tfield->get_name());
  } else if (type->is_container()) {
    generate_serialize_container(out, type, prefix + tfield->get_name());
  } else if (type->is_base_type() || type->is_enum()) {

    string name = prefix + tfield->get_name();

    if (binary_inline_) {
      if (type->is_base_type()) {
        t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
        switch (tbase) {
        case t_base_type::TYPE_VOID:
          throw "compiler error: cannot serialize void field in a struct: " + name;
          break;
        case t_base_type::TYPE_STRING:
          out << indent() << "$output .= pack('N', strlen($" << name << "));" << endl << indent()
              << "$output .= $" << name << ";" << endl;
          break;
        case t_base_type::TYPE_BOOL:
          out << indent() << "$output .= pack('c', $" << name << " ? 1 : 0);" << endl;
          break;
        case t_base_type::TYPE_I8:
          out << indent() << "$output .= pack('c', $" << name << ");" << endl;
          break;
        case t_base_type::TYPE_I16:
          out << indent() << "$output .= pack('n', $" << name << ");" << endl;
          break;
        case t_base_type::TYPE_I32:
          out << indent() << "$output .= pack('N', $" << name << ");" << endl;
          break;
        case t_base_type::TYPE_I64:
          out << indent() << "$output .= pack('N2', $" << name << " >> 32, $" << name
              << " & 0xFFFFFFFF);" << endl;
          break;
        case t_base_type::TYPE_DOUBLE:
          out << indent() << "$output .= strrev(pack('d', $" << name << "));" << endl;
          break;
        default:
          throw "compiler error: no PHP name for base type " + t_base_type::t_base_name(tbase);
        }
      } else if (type->is_enum()) {
        out << indent() << "$output .= pack('N', $" << name << ");" << endl;
      }
    } else {

      indent(out) << "$xfer += $output->";

      if (type->is_base_type()) {
        t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
        switch (tbase) {
        case t_base_type::TYPE_VOID:
          throw "compiler error: cannot serialize void field in a struct: " + name;
          break;
        case t_base_type::TYPE_STRING:
          out << "writeString($" << name << ");";
          break;
        case t_base_type::TYPE_BOOL:
          out << "writeBool($" << name << ");";
          break;
        case t_base_type::TYPE_I8:
          out << "writeByte($" << name << ");";
          break;
        case t_base_type::TYPE_I16:
          out << "writeI16($" << name << ");";
          break;
        case t_base_type::TYPE_I32:
          out << "writeI32($" << name << ");";
          break;
        case t_base_type::TYPE_I64:
          out << "writeI64($" << name << ");";
          break;
        case t_base_type::TYPE_DOUBLE:
          out << "writeDouble($" << name << ");";
          break;
        default:
          throw "compiler error: no PHP name for base type " + t_base_type::t_base_name(tbase);
        }
      } else if (type->is_enum()) {
        out << "writeI32($" << name << ");";
      }
      out << endl;
    }
  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s%s' TYPE '%s'\n",
           prefix.c_str(),
           tfield->get_name().c_str(),
           type->get_name().c_str());
  }
}